

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O2

void Ssw_ManDumpEquivMiter(Aig_Man_t *p,Vec_Int_t *vPairs,int Num)

{
  FILE *__stream;
  Aig_Man_t *pMan;
  undefined4 in_register_00000014;
  int level;
  char pBuffer [16];
  
  level = (int)pBuffer;
  sprintf(pBuffer,"equiv%03d.aig",CONCAT44(in_register_00000014,Num));
  __stream = fopen(pBuffer,"w");
  if (__stream == (FILE *)0x0) {
    Abc_Print(level,"Cannot open file %s for writing.\n",pBuffer);
  }
  else {
    fclose(__stream);
    pMan = Saig_ManCreateEquivMiter(p,vPairs);
    Ioa_WriteAiger(pMan,pBuffer,0,0);
    Aig_ManStop(pMan);
    Abc_Print((int)pMan,"AIG with %4d disproved equivs is dumped into file \"%s\".\n",
              (long)vPairs->nSize / 2 & 0xffffffff,pBuffer);
  }
  return;
}

Assistant:

void Ssw_ManDumpEquivMiter( Aig_Man_t * p, Vec_Int_t * vPairs, int Num )
{
    FILE * pFile;
    char pBuffer[16];
    Aig_Man_t * pNew;
    sprintf( pBuffer, "equiv%03d.aig", Num );
    pFile = fopen( pBuffer, "w" );
    if ( pFile == NULL )
    {
        Abc_Print( 1, "Cannot open file %s for writing.\n", pBuffer );
        return;
    }
    fclose( pFile );
    pNew = Saig_ManCreateEquivMiter( p, vPairs );
    Ioa_WriteAiger( pNew, pBuffer, 0, 0 );
    Aig_ManStop( pNew );
    Abc_Print( 1, "AIG with %4d disproved equivs is dumped into file \"%s\".\n", Vec_IntSize(vPairs)/2, pBuffer );
}